

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  ImGuiContext *pIVar5;
  uint uVar6;
  ImGuiWindow *pIVar7;
  bool bVar8;
  int char_count;
  bool is_last_line;
  bool is_first_line;
  char *line_end;
  ImGuiContext *pIStack_40;
  int tree_depth;
  char *text_remaining;
  bool log_new_line;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *text_end_local;
  char *text_local;
  ImVec2 *ref_pos_local;
  
  pIVar5 = GImGui;
  pIVar7 = ImGui::GetCurrentWindowRead();
  g = (ImGuiContext *)text_end;
  if (text_end == (char *)0x0) {
    g = (ImGuiContext *)ImGui::FindRenderedTextEnd(text,(char *)0x0);
  }
  fVar1 = ref_pos->y;
  fVar2 = (pIVar7->DC).LogLinePosY;
  (pIVar7->DC).LogLinePosY = ref_pos->y;
  if ((pIVar7->DC).TreeDepth < pIVar5->LogStartDepth) {
    pIVar5->LogStartDepth = (pIVar7->DC).TreeDepth;
  }
  iVar3 = (pIVar7->DC).TreeDepth;
  iVar4 = pIVar5->LogStartDepth;
  pIStack_40 = (ImGuiContext *)text;
  while( true ) {
    for (_char_count = pIStack_40; (_char_count < g && (_char_count->Initialized != true));
        _char_count = (ImGuiContext *)&_char_count->field_0x1) {
    }
    if (g <= _char_count) {
      _char_count = (ImGuiContext *)0x0;
    }
    bVar8 = _char_count == (ImGuiContext *)0x0;
    if (bVar8) {
      _char_count = g;
    }
    if ((_char_count != (ImGuiContext *)0x0) && ((!bVar8 || (_char_count != pIStack_40)))) {
      uVar6 = (int)_char_count - (int)pIStack_40;
      if ((fVar2 + 1.0 < fVar1) || ((ImGuiContext *)text != pIStack_40)) {
        ImGui::LogText("\n%*s%.*s",(ulong)(uint)((iVar3 - iVar4) * 4),"",(ulong)uVar6,pIStack_40);
      }
      else {
        ImGui::LogText(" %.*s",(ulong)uVar6,pIStack_40);
      }
    }
    if (bVar8) break;
    pIStack_40 = (ImGuiContext *)&_char_count->field_0x1;
  }
  return;
}

Assistant:

static void LogRenderedText(const ImVec2& ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = ImGui::GetCurrentWindowRead();

    if (!text_end)
        text_end = ImGui::FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos.y > window->DC.LogLinePosY+1;
    window->DC.LogLinePosY = ref_pos.y;

    const char* text_remaining = text;
    if (g.LogStartDepth > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogStartDepth = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogStartDepth);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        const char* line_end = text_remaining;
        while (line_end < text_end)
            if (*line_end == '\n')
                break;
            else
                line_end++;
        if (line_end >= text_end)
            line_end = NULL;

        const bool is_first_line = (text == text_remaining);
        bool is_last_line = false;
        if (line_end == NULL)
        {
            is_last_line = true;
            line_end = text_end;
        }
        if (line_end != NULL && !(is_last_line && (line_end - text_remaining)==0))
        {
            const int char_count = (int)(line_end - text_remaining);
            if (log_new_line || !is_first_line)
                ImGui::LogText(IM_NEWLINE "%*s%.*s", tree_depth*4, "", char_count, text_remaining);
            else
                ImGui::LogText(" %.*s", char_count, text_remaining);
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}